

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_BrepFace::SetDomain(ON_BrepFace *this,ON_Interval u_dom,ON_Interval v_dom)

{
  ON_Interval *this_00;
  double dVar1;
  ON_Interval new_interval;
  ON_Interval domain;
  ON_Interval new_interval_00;
  ON_Interval new_interval_01;
  ON_Interval domain_00;
  ON_Interval new_interval_02;
  ON_Interval old_interval;
  ON_Interval old_interval_00;
  ON_Interval old_interval_01;
  ON_Interval old_interval_02;
  ON_Interval domain_01;
  bool bVar2;
  int iVar3;
  ON_Surface *pS;
  undefined4 extraout_var;
  __shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ON_Interval *pOVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  ON_Xform *pOVar9;
  array<std::shared_ptr<const_ON_Mesh>,_3UL> *paVar10;
  ON_Xform *pOVar11;
  long lVar12;
  byte bVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double dVar14;
  ON_Interval local_288;
  ON_Interval local_278;
  ON_Interval v0_dom;
  ON_Interval u0_dom;
  array<std::shared_ptr<const_ON_Mesh>,_3UL> meshes;
  ON_Xform vx;
  ON_Interval dom1;
  ON_Xform local_b0;
  
  local_288.m_t[1] = v_dom.m_t[1];
  local_288.m_t[0] = v_dom.m_t[0];
  dVar14 = u_dom.m_t[1];
  bVar13 = 0;
  local_278.m_t[0] = u_dom.m_t[0];
  if ((((this->m_brep != (ON_Brep *)0x0) &&
       (local_278.m_t[1] = dVar14, bVar2 = ON_Interval::IsIncreasing(&local_278), bVar2)) &&
      (bVar2 = ON_Interval::IsIncreasing(&local_288), bVar2)) &&
     (pS = SurfaceOf(this), pS != (ON_Surface *)0x0)) {
    (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,0);
    u0_dom.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    u0_dom.m_t[1] = dVar14;
    (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,1);
    v0_dom.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    v0_dom.m_t[1] = dVar14;
    bVar2 = ON_Interval::operator==(&u0_dom,&local_278);
    if ((bVar2) && (bVar2 = ON_Interval::operator==(&v0_dom,&local_288), bVar2)) {
      return true;
    }
    lVar8 = 0x10;
    pOVar9 = &ON_Xform::IdentityTransformation;
    paVar10 = &meshes;
    for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
      paVar10->_M_elems[0].super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pOVar9->m_xform[0][0];
      pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
      paVar10 = (array<std::shared_ptr<const_ON_Mesh>,_3UL> *)
                ((long)paVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    pOVar9 = &ON_Xform::IdentityTransformation;
    pOVar11 = &vx;
    for (; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar11->m_xform[0][0] = pOVar9->m_xform[0][0];
      pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
      pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
    }
    bVar2 = ON_Interval::operator!=(&u0_dom,&local_278);
    if (((!bVar2) ||
        (old_interval_01.m_t[1] = u0_dom.m_t[1], old_interval_01.m_t[0] = u0_dom.m_t[0],
        new_interval_01.m_t[1] = local_278.m_t[1], new_interval_01.m_t[0] = local_278.m_t[0],
        dVar14 = u0_dom.m_t[1],
        bVar2 = ON_Xform::IntervalChange((ON_Xform *)&meshes,0,old_interval_01,new_interval_01),
        bVar2)) &&
       ((bVar2 = ON_Interval::operator!=(&v0_dom,&local_288), !bVar2 ||
        (old_interval.m_t[1] = v0_dom.m_t[1], old_interval.m_t[0] = v0_dom.m_t[0],
        new_interval.m_t[1] = local_288.m_t[1], new_interval.m_t[0] = local_288.m_t[0],
        dVar14 = v0_dom.m_t[1], bVar2 = ON_Xform::IntervalChange(&vx,1,old_interval,new_interval),
        bVar2)))) {
      ON_Xform::operator*((ON_Xform *)&dom1,(ON_Xform *)&meshes,&vx);
      pOVar9 = (ON_Xform *)&dom1;
      pOVar11 = &local_b0;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar11->m_xform[0][0] = pOVar9->m_xform[0][0];
        pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
        pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
      }
      (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[0x17])(this,1);
      iVar3 = ON_Brep::SurfaceUseCount(this->m_brep,this->m_si,2);
      if (1 < iVar3) {
        iVar3 = (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(pS);
        pS = (ON_Surface *)CONCAT44(extraout_var,iVar3);
        iVar3 = ON_Brep::AddSurface(this->m_brep,pS);
        this->m_si = iVar3;
        ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,pS);
      }
      bVar2 = ON_Interval::operator!=(&local_278,&u0_dom);
      if ((bVar2) &&
         (domain_00.m_t[1] = local_278.m_t[1], domain_00.m_t[0] = local_278.m_t[0],
         dVar14 = local_278.m_t[1], bVar2 = ON_Surface::SetDomain(pS,0,domain_00), !bVar2)) {
        return false;
      }
      bVar2 = ON_Interval::operator!=(&local_288,&v0_dom);
      if ((bVar2) &&
         (domain.m_t[1] = local_288.m_t[1], domain.m_t[0] = local_288.m_t[0],
         dVar14 = local_288.m_t[1], bVar2 = ON_Surface::SetDomain(pS,1,domain), !bVar2)) {
        domain_01.m_t[1] = u0_dom.m_t[1];
        domain_01.m_t[0] = u0_dom.m_t[0];
        ON_Surface::SetDomain(pS,0,domain_01);
        return false;
      }
      (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,0);
      local_278.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      local_278.m_t[1] = dVar14;
      (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,1);
      local_288.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      lVar8 = 0x10;
      pOVar9 = &ON_Xform::IdentityTransformation;
      paVar10 = &meshes;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        paVar10->_M_elems[0].super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pOVar9->m_xform[0][0];
        pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
        paVar10 = (array<std::shared_ptr<const_ON_Mesh>,_3UL> *)
                  ((long)paVar10 + ((ulong)bVar13 * -2 + 1) * 8);
      }
      pOVar9 = &ON_Xform::IdentityTransformation;
      pOVar11 = &vx;
      for (; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar11->m_xform[0][0] = pOVar9->m_xform[0][0];
        pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
        pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
      }
      local_288.m_t[1] = dVar14;
      bVar2 = ON_Interval::operator!=(&u0_dom,&local_278);
      if (((!bVar2) ||
          (old_interval_02.m_t[1] = u0_dom.m_t[1], old_interval_02.m_t[0] = u0_dom.m_t[0],
          new_interval_02.m_t[1] = local_278.m_t[1], new_interval_02.m_t[0] = local_278.m_t[0],
          bVar2 = ON_Xform::IntervalChange((ON_Xform *)&meshes,0,old_interval_02,new_interval_02),
          bVar2)) &&
         ((bVar2 = ON_Interval::operator!=(&v0_dom,&local_288), !bVar2 ||
          (old_interval_00.m_t[1] = v0_dom.m_t[1], old_interval_00.m_t[0] = v0_dom.m_t[0],
          new_interval_00.m_t[1] = local_288.m_t[1], new_interval_00.m_t[0] = local_288.m_t[0],
          bVar2 = ON_Xform::IntervalChange(&vx,1,old_interval_00,new_interval_00), bVar2)))) {
        ON_Xform::operator*((ON_Xform *)&dom1,(ON_Xform *)&meshes,&vx);
        pOVar9 = (ON_Xform *)&dom1;
        pOVar11 = &local_b0;
        for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
          pOVar11->m_xform[0][0] = pOVar9->m_xform[0][0];
          pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
          pOVar11 = (ON_Xform *)((long)pOVar11 + ((ulong)bVar13 * -2 + 1) * 8);
        }
        bVar2 = TransformTrim(this,&local_b0);
        if (bVar2) {
          p_Var4 = &UniqueMesh(this,analysis_mesh)->
                    super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)&meshes,p_Var4);
          p_Var4 = &UniqueMesh(this,render_mesh)->
                    super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&meshes._M_elems[1].
                      super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>,p_Var4);
          p_Var4 = &UniqueMesh(this,preview_mesh)->
                    super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&meshes._M_elems[2].
                      super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>,p_Var4);
          for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
            lVar7 = *(long *)((long)&meshes._M_elems[0].
                                     super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr + lVar8);
            if (lVar7 != 0) {
              for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 0x10) {
                pOVar5 = &v0_dom;
                if (lVar12 == 0) {
                  pOVar5 = &u0_dom;
                }
                this_00 = (ON_Interval *)(lVar7 + 0x240 + lVar12);
                vx.m_xform[0][0] = pOVar5->m_t[0];
                vx.m_xform[0][1] = pOVar5->m_t[1];
                pOVar5 = &local_288;
                if (lVar12 == 0) {
                  pOVar5 = &local_278;
                }
                dom1.m_t[0] = pOVar5->m_t[0];
                dom1.m_t[1] = pOVar5->m_t[1];
                bVar2 = ON_Interval::IsIncreasing(this_00);
                if ((bVar2) && (bVar2 = ON_Interval::operator!=((ON_Interval *)&vx,&dom1), bVar2)) {
                  bVar2 = ON_Interval::operator==(this_00,(ON_Interval *)&vx);
                  if (bVar2) {
                    this_00->m_t[0] = dom1.m_t[0];
                    this_00->m_t[1] = dom1.m_t[1];
                  }
                  else {
                    pdVar6 = ON_Interval::operator[](this_00,0);
                    dVar14 = ON_Interval::NormalizedParameterAt((ON_Interval *)&vx,*pdVar6);
                    dVar14 = ON_Interval::ParameterAt(&dom1,dVar14);
                    pdVar6 = ON_Interval::operator[](this_00,1);
                    dVar1 = ON_Interval::NormalizedParameterAt((ON_Interval *)&vx,*pdVar6);
                    dVar1 = ON_Interval::ParameterAt(&dom1,dVar1);
                    ON_Interval::Set(this_00,dVar14,dVar1);
                  }
                }
              }
            }
          }
          std::array<std::shared_ptr<const_ON_Mesh>,_3UL>::~array(&meshes);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_BrepFace::SetDomain(
       ON_Interval u_dom,
       ON_Interval v_dom
       )
{
  if ( 0 == m_brep )
    return false;
  if ( !u_dom.IsIncreasing() )
    return false;
  if ( !v_dom.IsIncreasing() )
    return false;
  
  ON_Surface* srf = const_cast<ON_Surface*>(SurfaceOf());
  if ( 0 == srf )
    return false;

  ON_Interval u0_dom = srf->Domain(0);
  ON_Interval v0_dom = srf->Domain(1);
  if ( u0_dom == u_dom && v0_dom == v_dom )
    return true;

  ON_Xform xform(ON_Xform::IdentityTransformation);
  {
    ON_Xform ux(ON_Xform::IdentityTransformation), vx(ON_Xform::IdentityTransformation);
    if ( u0_dom != u_dom )
    {
      if ( !ux.IntervalChange(0,u0_dom,u_dom) )
        return false;
    }
    if ( v0_dom != v_dom )
    {
      if ( !vx.IntervalChange(1,v0_dom,v_dom) )
        return false;
    }
    xform = ux*vx;
  }

// 2/18/03 GBA.  Destroy cache on the face.
	DestroyRuntimeCache(true);

  if ( m_brep->SurfaceUseCount( m_si, 2 ) > 1 )
  {
    srf = srf->DuplicateSurface();
    m_si = m_brep->AddSurface(srf);
    SetProxySurface(srf);
  }

  if ( u_dom != u0_dom )
  {
    if ( !srf->SetDomain( 0, u_dom ) )
      return false;
  }

  if ( v_dom != v0_dom )
  {
    if ( !srf->SetDomain( 1, v_dom ) )
    {
      srf->SetDomain(0,u0_dom );
      return false;
    }
  }

  // just to be sure 2d curves are in synch with actual surface
  // domain in case srf->SetDomain() does something weird.
  u_dom = srf->Domain(0);
  v_dom = srf->Domain(1);
  {
    ON_Xform ux(ON_Xform::IdentityTransformation), vx(ON_Xform::IdentityTransformation);
    if ( u0_dom != u_dom )
    {
      if ( !ux.IntervalChange(0,u0_dom,u_dom) )
        return false;
    }
    if ( v0_dom != v_dom )
    {
      if ( !vx.IntervalChange(1,v0_dom,v_dom) )
        return false;
    }
    xform = ux*vx;
  }

  if ( !TransformTrim(xform) )
    return false;

  std::array<std::shared_ptr<const ON_Mesh>, 3> meshes { UniqueMesh(ON::analysis_mesh),  UniqueMesh(ON::render_mesh),  UniqueMesh(ON::preview_mesh) };

  for (auto& m : meshes)
  {
    if (m)
    {
      auto pMesh = const_cast<ON_Mesh*>(m.get());
      for ( int dir = 0; dir < 2; dir++ )
      {
        ON_Interval& mdom = pMesh->m_srf_domain[dir];

        const ON_Interval dom0 = dir ? v0_dom : u0_dom;
        const ON_Interval dom1 = dir ? v_dom : u_dom;

        if ( mdom.IsIncreasing() && dom0 != dom1 )
        {
          if ( mdom == dom0 )
          {
            mdom = dom1;
          }
          else
          {
            double t0 = dom1.ParameterAt(dom0.NormalizedParameterAt(mdom[0]));
            double t1 = dom1.ParameterAt(dom0.NormalizedParameterAt(mdom[1]));
            mdom.Set(t0,t1);
          }
        }
      }
    }
  }

  return true;
}